

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O2

int __thiscall
libchars::terminal_driver::cursor_position
          (terminal_driver *this,size_t *x,size_t *y,ssize_t timeout_ms)

{
  ulong uVar1;
  uint8_t *puVar2;
  int iVar3;
  ssize_t sVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  uint uVar12;
  long lVar13;
  byte bVar14;
  undefined1 auStack_58 [8];
  timeval T_start;
  timeval T_now;
  
  *y = 0;
  *x = 0;
  sVar4 = write(this,0x118c50,(void *)0x4,timeout_ms);
  if ((int)sVar4 == 0) {
    lVar13 = 5000;
    if (-1 < timeout_ms) {
      lVar13 = timeout_ms;
    }
    auStack_58 = (undefined1  [8])0x0;
    T_start.tv_sec = 0;
    gettimeofday((timeval *)auStack_58,(__timezone_ptr_t)0x0);
    lVar7 = (long)auStack_58 * 1000;
    uVar5 = (ulong)T_start.tv_sec / 1000;
    do {
      sVar11 = this->rbuf_enq;
      if (this->rbuf_deq + 6 <= sVar11) {
        puVar2 = this->rbuf;
        uVar8 = this->rbuf_size;
        uVar1 = uVar8 - 1;
        bVar14 = 0;
        uVar9 = this->rbuf_deq;
        while (uVar6 = uVar9 + 1, uVar9 < sVar11) {
          if (bVar14 < 4) {
            uVar12 = (uint)puVar2[uVar9 & uVar1];
            switch(bVar14) {
            case 0:
              bVar14 = uVar12 == 0x1b;
              if ((bool)bVar14) {
                uVar8 = uVar9;
              }
              break;
            case 1:
              if (uVar12 != 0x5b) {
                uVar8 = this->rbuf_size;
              }
              bVar14 = (uVar12 == 0x5b) * '\x02';
              break;
            case 2:
              if (uVar12 == 0x3b) {
LAB_001163a6:
                bVar14 = 3;
              }
              else {
                if (9 < uVar12 - 0x30) goto LAB_001163c5;
                *y = (ulong)(uVar12 - 0x30) + *y * 10;
                bVar14 = 2;
              }
              break;
            case 3:
              uVar9 = uVar6;
              uVar10 = uVar8;
              if (uVar12 == 0x52) {
                for (; uVar9 < sVar11; uVar9 = uVar9 + 1) {
                  this->rbuf[uVar10 & uVar1] = this->rbuf[uVar9 & uVar1];
                  sVar11 = this->rbuf_enq;
                  uVar10 = uVar10 + 1;
                }
                this->rbuf_enq = (uVar8 + sVar11) - uVar6;
                return 0;
              }
              if (uVar12 - 0x30 < 10) {
                *x = (ulong)(uVar12 - 0x30) + *x * 10;
                goto LAB_001163a6;
              }
LAB_001163c5:
              bVar14 = 0;
              uVar8 = this->rbuf_size;
            }
          }
          uVar9 = uVar6;
          sVar11 = this->rbuf_enq;
        }
      }
      iVar3 = read_characters(this,true);
      if (iVar3 < 0) {
        return iVar3;
      }
    } while ((iVar3 != 0) ||
            ((iVar3 = gettimeofday((timeval *)&T_start.tv_usec,(__timezone_ptr_t)0x0), iVar3 == 0 &&
             ((ulong)T_now.tv_sec / 1000 + T_start.tv_usec * 1000 < lVar7 + lVar13 + uVar5))));
  }
  return -1;
}

Assistant:

int terminal_driver::cursor_position(size_t &x, size_t &y, ssize_t timeout_ms)
    {
        x = y = 0;

        //XXX: do not check for 'control_enabled' because this function is used to determine 'control_enabled'

        if (timeout_ms < 0)
            timeout_ms = LC_CURSOR_POSITION_READ_TIMEOUT_ms;

        int r = write("\x1b[6n", 4);
        if (r != 0)
            return r;

        struct timeval T_start = { 0, 0 };
        gettimeofday(&T_start, NULL);

        while (true) {
            // search for pattern: ^[yyy;xxxR  (minimum of 6 characters)
            if (rbuf_enq >= (rbuf_deq + 6)) {
                enum { WAIT_ESC0, WAIT_ESC1, WAIT_SEMI, WAIT_TERM } seq_state = WAIT_ESC0;
                size_t rbuf_mask = (rbuf_size - 1);
                size_t rbuf_search = rbuf_deq;
                size_t rbuf_found = rbuf_size;
                while (rbuf_search < rbuf_enq) {
                    uint8_t c = *(rbuf + (rbuf_search & rbuf_mask));
                    switch (seq_state) {
                    case WAIT_ESC0:
                        if (c == 0x1b) {
                            seq_state = WAIT_ESC1;
                            rbuf_found = rbuf_search;
                        }
                        break;
                    case WAIT_ESC1:
                        if (c == '[') {
                            seq_state = WAIT_SEMI;
                        }
                        else {
                            seq_state = WAIT_ESC0;
                            rbuf_found = rbuf_size;
                        }
                        break;
                    case WAIT_SEMI:
                        if (c == ';') {
                            seq_state = WAIT_TERM;
                        }
                        else if (isdigit(c)) {
                            y = y*10 + (c-'0');
                        }
                        else {
                            seq_state = WAIT_ESC0;
                            rbuf_found = rbuf_size;
                        }
                        break;
                    case WAIT_TERM:
                        if (c == 'R') {
                            // pattern found; remove bytes from buffer
                            ++rbuf_search;
                            size_t rbuf_copy_to = rbuf_found;
                            size_t rbuf_copy_from = rbuf_search;
                            while (rbuf_copy_from < rbuf_enq) {
                                *(rbuf + (rbuf_copy_to & rbuf_mask)) = *(rbuf + (rbuf_copy_from & rbuf_mask));
                                ++rbuf_copy_to;
                                ++rbuf_copy_from;
                            }
                            rbuf_enq -= (rbuf_search - rbuf_found);
                            return 0;
                        }
                        else if (isdigit(c)) {
                            x = x*10 + (c-'0');
                        }
                        else {
                            seq_state = WAIT_ESC0;
                            rbuf_found = rbuf_size;
                        }
                        break;
                    }
                    ++rbuf_search;
                }
            }
            // pattern not found; need more characters
            r = read_characters(true);
            if (r < 0)
                return r;
            else if (r == 0) {
                // timeout logic
                struct timeval T_now;
                if (gettimeofday(&T_now, NULL) == 0) {
                    uint64_t t_msec_now = T_now.tv_sec * 1000ULL + T_now.tv_usec/1000ULL;
                    uint64_t t_msec_start = T_start.tv_sec * 1000ULL + T_start.tv_usec/1000ULL;
                    if (t_msec_now >= (t_msec_start + timeout_ms))
                        return -1;
                }
                else {
                    return -1;
                }
            }
        }
    }